

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O2

value_type __thiscall
QList<std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorVertex_*>_>::
takeFirst(QList<std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorVertex_*>_>
          *this)

{
  pair<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorVertex_*> **pppVar1;
  qsizetype *pqVar2;
  iterator iVar3;
  value_type vVar4;
  
  iVar3 = begin(this);
  pppVar1 = &(this->d).ptr;
  *pppVar1 = *pppVar1 + 1;
  pqVar2 = &(this->d).size;
  *pqVar2 = *pqVar2 + -1;
  vVar4.first = (iVar3.i)->first;
  vVar4.second = (iVar3.i)->second;
  return vVar4;
}

Assistant:

value_type takeFirst() { Q_ASSERT(!isEmpty()); value_type v = std::move(first()); d->eraseFirst(); return v; }